

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O0

void __thiscall
tchecker::tck_simulate::hr_display_t::hr_display_t
          (hr_display_t *this,ostream *os,shared_ptr<tchecker::zg::zg_t> *zg)

{
  element_type *peVar1;
  invalid_argument *this_00;
  shared_ptr<tchecker::zg::zg_t> *zg_local;
  ostream *os_local;
  hr_display_t *this_local;
  
  display_t::display_t(&this->super_display_t);
  (this->super_display_t)._vptr_display_t = (_func_int **)&PTR__hr_display_t_003aca10;
  this->_os = os;
  std::shared_ptr<tchecker::zg::zg_t>::shared_ptr(&this->_zg,zg);
  peVar1 = std::__shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->_zg).
                       super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>);
  if (peVar1 == (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Invalid nullptr zone graph");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

hr_display_t::hr_display_t(std::ostream & os, std::shared_ptr<tchecker::zg::zg_t> const & zg) : _os(os), _zg(zg)
{
  if (_zg.get() == nullptr)
    throw std::invalid_argument("Invalid nullptr zone graph");
}